

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

_Bool ggml_is_contiguous_n(ggml_tensor *tensor,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int64_t iVar3;
  int in_ESI;
  ggml_type *in_RDI;
  int i;
  size_t next_nb;
  int local_24;
  undefined8 local_20;
  _Bool local_1;
  
  local_20 = ggml_type_size(*in_RDI);
  uVar1 = *(undefined8 *)(in_RDI + 4);
  uVar2 = ggml_blck_size(*in_RDI);
  if ((uVar1 == uVar2) || (*(undefined8 *)(in_RDI + 0xc) == local_20)) {
    uVar1 = *(undefined8 *)(in_RDI + 4);
    iVar3 = ggml_blck_size(*in_RDI);
    local_20 = ((long)uVar1 / iVar3) * local_20;
    for (local_24 = 1; local_24 < 4; local_24 = local_24 + 1) {
      if (*(undefined8 *)(in_RDI + (long)local_24 * 2 + 4) != GGML_TYPE_F16) {
        if (in_ESI < local_24) {
          if (*(undefined8 *)(in_RDI + (long)local_24 * 2 + 0xc) != local_20) {
            return false;
          }
          local_20 = *(undefined8 *)(in_RDI + (long)local_24 * 2 + 4) * local_20;
        }
        else {
          local_20 = *(undefined8 *)(in_RDI + (long)local_24 * 2 + 4) *
                     *(undefined8 *)(in_RDI + (long)local_24 * 2 + 0xc);
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ggml_is_contiguous_n(const struct ggml_tensor * tensor, int n) {
    size_t next_nb = ggml_type_size(tensor->type);
    if (tensor->ne[0] != ggml_blck_size(tensor->type) && tensor->nb[0] != next_nb) {
        return false;
    }
    next_nb *= tensor->ne[0]/ggml_blck_size(tensor->type);
    for (int i = 1; i < GGML_MAX_DIMS; i++) {
        if (tensor->ne[i] != 1) {
            if (i > n) {
                if (tensor->nb[i] != next_nb) {
                    return false;
                }
                next_nb *= tensor->ne[i];
            } else {
                // this dimension does not need to be contiguous
                next_nb = tensor->ne[i]*tensor->nb[i];
            }
        }
    }
    return true;
}